

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_cte_node.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan(Binder *this,BoundCTENode *node)

{
  long *plVar1;
  Binder *pBVar2;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  pointer *__ptr;
  undefined1 uVar3;
  BoundQueryNode *node_00;
  long *local_40;
  undefined1 local_38 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)(in_RDX + 0xf));
  CreatePlan((Binder *)(local_38 + 8),&node->super_BoundQueryNode);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)(in_RDX + 0x10));
  CreatePlan((Binder *)local_38,&node->super_BoundQueryNode);
  node_00 = (BoundQueryNode *)(in_RDX + 0xb);
  local_28._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (((long)in_RDX[9].
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl -
         (long)in_RDX[8].
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl >> 3) *
       -0x5555555555555555);
  make_uniq<duckdb::LogicalMaterializedCTE,std::__cxx11::string&,unsigned_long&,unsigned_long,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
            ((duckdb *)&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)node_00,
             (unsigned_long *)(in_RDX + 0x11),(unsigned_long *)&local_28,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)(local_38 + 8),
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)local_38);
  uVar3 = 1;
  if (*(char *)&node[3].super_BoundQueryNode.modifiers.
                super_vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start == '\0') {
    pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->
                       ((shared_ptr<duckdb::Binder,_true> *)(in_RDX + 0x14));
    if (pBVar2->has_unplanned_dependent_joins == false) {
      pBVar2 = shared_ptr<duckdb::Binder,_true>::operator->
                         ((shared_ptr<duckdb::Binder,_true> *)(in_RDX + 0x12));
      uVar3 = pBVar2->has_unplanned_dependent_joins;
    }
  }
  plVar1 = local_40;
  *(undefined1 *)
   &node[3].super_BoundQueryNode.modifiers.
    super_vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = uVar3;
  local_40 = (long *)0x0;
  VisitQueryNode(this,node_00,in_RDX);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  if (local_40 != (long *)0x0) {
    (**(code **)(*local_40 + 8))();
  }
  if ((tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
      local_38._0_8_ != (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_38._0_8_)->__weak_this_).internal
                .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)local_38._8_8_)[1])();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundCTENode &node) {
	// Generate the logical plan for the cte_query and child.
	auto cte_query = CreatePlan(*node.query);
	auto cte_child = CreatePlan(*node.child);

	auto root = make_uniq<LogicalMaterializedCTE>(node.ctename, node.setop_index, node.types.size(),
	                                              std::move(cte_query), std::move(cte_child));

	// check if there are any unplanned subqueries left in either child
	has_unplanned_dependent_joins = has_unplanned_dependent_joins || node.child_binder->has_unplanned_dependent_joins ||
	                                node.query_binder->has_unplanned_dependent_joins;

	return VisitQueryNode(node, std::move(root));
}